

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version.cpp
# Opt level: O3

char * ON::SourceGitBranchName(void)

{
  return "";
}

Assistant:

const char* ON::SourceGitBranchName()
{
#if defined(OPENNURBS_GIT_BRANCH_NAME)
  const char* name = OPENNURBS_GIT_BRANCH_NAME;
  if (nullptr != name && '0' == name[0] && 0 == name[1])
    name = nullptr;
  if (nullptr != name && 0 != name[0])
    return OPENNURBS_GIT_BRANCH_NAME;
#endif
  return "";
}